

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O2

bool __thiscall
OSSLECDSA::reconstructKeyPair
          (OSSLECDSA *this,AsymmetricKeyPair **ppKeyPair,ByteString *serialisedData)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  OSSLECKeyPair *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ByteString dPriv;
  ByteString dPub;
  ByteString BStack_68;
  ByteString local_40;
  
  if ((ppKeyPair != (AsymmetricKeyPair **)0x0) &&
     (sVar4 = ByteString::size(serialisedData), sVar4 != 0)) {
    ByteString::chainDeserialise(&local_40,serialisedData);
    ByteString::chainDeserialise(&BStack_68,serialisedData);
    this_00 = (OSSLECKeyPair *)operator_new(200);
    memset(this_00,0,200);
    OSSLECKeyPair::OSSLECKeyPair(this_00);
    iVar3 = (*(this_00->super_AsymmetricKeyPair).super_Serialisable._vptr_Serialisable[3])(this_00);
    bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var,iVar3),&local_40);
    iVar3 = (*(this_00->super_AsymmetricKeyPair).super_Serialisable._vptr_Serialisable[5])(this_00);
    bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x68))
                      ((long *)CONCAT44(extraout_var_00,iVar3),&BStack_68);
    if ((bVar1 & bVar2) == 0) {
      (*(this_00->super_AsymmetricKeyPair).super_Serialisable._vptr_Serialisable[2])(this_00);
    }
    else {
      *ppKeyPair = (AsymmetricKeyPair *)this_00;
    }
    ByteString::~ByteString(&BStack_68);
    ByteString::~ByteString(&local_40);
    return (bool)(bVar1 & bVar2);
  }
  return false;
}

Assistant:

bool OSSLECDSA::reconstructKeyPair(AsymmetricKeyPair** ppKeyPair, ByteString& serialisedData)
{
	// Check input
	if ((ppKeyPair == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	ByteString dPub = ByteString::chainDeserialise(serialisedData);
	ByteString dPriv = ByteString::chainDeserialise(serialisedData);

	OSSLECKeyPair* kp = new OSSLECKeyPair();

	bool rv = true;

	if (!((ECPublicKey*) kp->getPublicKey())->deserialise(dPub))
	{
		rv = false;
	}

	if (!((ECPrivateKey*) kp->getPrivateKey())->deserialise(dPriv))
	{
		rv = false;
	}

	if (!rv)
	{
		delete kp;

		return false;
	}

	*ppKeyPair = kp;

	return true;
}